

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

void nghttp2_frame_unpack_priority_spec(nghttp2_priority_spec *pri_spec,uint8_t *payload)

{
  uint32_t uVar1;
  
  uVar1 = nghttp2_get_uint32(payload);
  nghttp2_priority_spec_init(pri_spec,uVar1 & 0x7fffffff,payload[4] + 1,(uint)(*payload >> 7));
  return;
}

Assistant:

void nghttp2_frame_unpack_priority_spec(nghttp2_priority_spec *pri_spec,
                                        const uint8_t *payload) {
  int32_t dep_stream_id;
  uint8_t exclusive;
  int32_t weight;

  dep_stream_id = nghttp2_get_uint32(payload) & NGHTTP2_STREAM_ID_MASK;
  exclusive = (payload[0] & 0x80) > 0;
  weight = payload[4] + 1;

  nghttp2_priority_spec_init(pri_spec, dep_stream_id, weight, exclusive);
}